

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

bool Assimp::BaseImporter::SearchFileHeaderForToken
               (IOSystem *pIOHandler,string *pFile,char **tokens,uint numTokens,uint searchBytes,
               bool tokensSol,bool noAlphaBeforeTokens)

{
  char **s;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__haystack;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  Logger *this;
  bool bVar7;
  size_t sVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  string token;
  char *local_1f0;
  undefined8 local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  char **local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  long *plVar3;
  
  if (tokens == (char **)0x0) {
    __assert_fail("nullptr != tokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xb9,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (numTokens == 0) {
    __assert_fail("0 != numTokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xba,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (searchBytes == 0) {
    __assert_fail("0 != searchBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xbb,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (pIOHandler == (IOSystem *)0x0) {
    return false;
  }
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8[0]);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (plVar3 != (long *)0x0) {
    __haystack = (char *)operator_new__((ulong)(searchBytes + 1));
    lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,__haystack,1);
    bVar7 = lVar4 != 0;
    if (lVar4 == 0) {
      operator_delete__(__haystack);
      bVar7 = false;
      goto LAB_003c60d3;
    }
    lVar9 = 0;
    local_1d0 = tokens;
    do {
      iVar1 = tolower((int)__haystack[lVar9]);
      __haystack[lVar9] = (char)iVar1;
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
    lVar9 = 0;
    pcVar5 = __haystack;
    do {
      if (__haystack[lVar9] != '\0') {
        *pcVar5 = __haystack[lVar9];
        pcVar5 = pcVar5 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
    uVar10 = 0;
    *pcVar5 = '\0';
    local_1f0 = &local_1e0;
    local_1e8 = 0;
    local_1e0 = '\0';
    do {
      if (local_1d0[uVar10] == (char *)0x0) {
        __assert_fail("nullptr != tokens[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                      ,0xdc,
                      "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                     );
      }
      s = local_1d0 + uVar10;
      sVar6 = strlen(local_1d0[uVar10]);
      local_1e8 = 0;
      *local_1f0 = '\0';
      if (sVar6 != 0) {
        pcVar5 = *s;
        sVar8 = 0;
        do {
          tolower((int)pcVar5[sVar8]);
          std::__cxx11::string::push_back((char)&local_1f0);
          sVar8 = sVar8 + 1;
        } while (sVar6 != sVar8);
      }
      pcVar5 = strstr(__haystack,local_1f0);
      iVar1 = 9;
      if (((pcVar5 != (char *)0x0) &&
          ((pcVar5 == __haystack || !noAlphaBeforeTokens ||
           (iVar2 = isalpha((int)pcVar5[-1]), iVar2 == 0)))) &&
         ((pcVar5 == __haystack || !tokensSol ||
          ((pcVar5[-1] == '\r' || (iVar1 = 0, pcVar5[-1] == '\n')))))) {
        this = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[42]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [42])"Found positive match for header keyword: ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,s)
        ;
        std::__cxx11::stringbuf::str();
        Logger::debug(this,(char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        iVar1 = 1;
      }
      if ((iVar1 != 9) && (iVar1 != 0)) goto LAB_003c6084;
      uVar10 = uVar10 + 1;
    } while (uVar10 != numTokens + (numTokens == 0));
    iVar1 = 7;
LAB_003c6084:
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    operator_delete__(__haystack);
    if ((iVar1 != 0) && (iVar1 != 7)) goto LAB_003c60d3;
  }
  bVar7 = false;
LAB_003c60d3:
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return bVar7;
}

Assistant:

bool BaseImporter::SearchFileHeaderForToken( IOSystem* pIOHandler,
    const std::string&  pFile,
    const char**        tokens,
    unsigned int        numTokens,
    unsigned int        searchBytes /* = 200 */,
    bool                tokensSol /* false */,
    bool                noAlphaBeforeTokens /* false */)
{
    ai_assert( nullptr != tokens );
    ai_assert( 0 != numTokens );
    ai_assert( 0 != searchBytes);

    if ( nullptr == pIOHandler ) {
        return false;
    }

    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {
        // read 200 characters from the file
        std::unique_ptr<char[]> _buffer (new char[searchBytes+1 /* for the '\0' */]);
        char *buffer( _buffer.get() );
        const size_t read( pStream->Read(buffer,1,searchBytes) );
        if( 0 == read ) {
            return false;
        }

        for( size_t i = 0; i < read; ++i ) {
            buffer[ i ] = static_cast<char>( ::tolower( buffer[ i ] ) );
        }

        // It is not a proper handling of unicode files here ...
        // ehm ... but it works in most cases.
        char* cur = buffer,*cur2 = buffer,*end = &buffer[read];
        while (cur != end)  {
            if( *cur ) {
                *cur2++ = *cur;
            }
            ++cur;
        }
        *cur2 = '\0';

        std::string token;
        for (unsigned int i = 0; i < numTokens; ++i ) {
            ai_assert( nullptr != tokens[i] );
            const size_t len( strlen( tokens[ i ] ) );
            token.clear();
            const char *ptr( tokens[ i ] );
            for ( size_t tokIdx = 0; tokIdx < len; ++tokIdx ) {
                token.push_back( static_cast<char>( tolower( *ptr ) ) );
                ++ptr;
            }
            const char* r = strstr( buffer, token.c_str() );
            if( !r ) {
                continue;
            }
            // We need to make sure that we didn't accidentially identify the end of another token as our token,
            // e.g. in a previous version the "gltf " present in some gltf files was detected as "f "
            if (noAlphaBeforeTokens && (r != buffer && isalpha(r[-1]))) {
                continue;
            }
            // We got a match, either we don't care where it is, or it happens to
            // be in the beginning of the file / line
            if (!tokensSol || r == buffer || r[-1] == '\r' || r[-1] == '\n') {
                ASSIMP_LOG_DEBUG_F( "Found positive match for header keyword: ", tokens[i] );
                return true;
            }
        }
    }

    return false;
}